

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntegratorCreator.hpp
# Opt level: O0

void __thiscall
OpenMD::IntegratorBuilder<OpenMD::NVE>::~IntegratorBuilder(IntegratorBuilder<OpenMD::NVE> *this)

{
  void *in_RDI;
  
  ~IntegratorBuilder((IntegratorBuilder<OpenMD::NVE> *)0x250e38);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

IntegratorBuilder(const std::string& ident) : IntegratorCreator(ident) {}